

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O0

bool __thiscall Js::JavascriptSet::TryAddToIntSet(JavascriptSet *this,Var value)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  BVIndex i;
  undefined4 *puVar4;
  BVSparse<Memory::Recycler> *this_00;
  Recycler *recycler;
  Var pvStack_28;
  int32 intVal;
  Var taggedInt;
  Var value_local;
  JavascriptSet *this_local;
  
  taggedInt = value;
  value_local = this;
  if (this->kind != IntSet) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x168,"(this->kind == SetKind::IntSet)",
                                "this->kind == SetKind::IntSet");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pvStack_28 = JavascriptConversion::TryCanonicalizeAsTaggedInt<false,false>(taggedInt);
  if (pvStack_28 == (Var)0x0) {
    this_local._7_1_ = false;
  }
  else {
    i = TaggedInt::ToInt32(pvStack_28);
    this_00 = Memory::WriteBarrierPtr<BVSparse<Memory::Recycler>_>::operator->
                        ((WriteBarrierPtr<BVSparse<Memory::Recycler>_> *)&(this->u).simpleVarSet);
    BVar3 = BVSparse<Memory::Recycler>::TestAndSet(this_00,i);
    if (BVar3 == '\0') {
      recycler = RecyclableObject::GetRecycler((RecyclableObject *)this);
      MapOrSetDataList<void_*>::Append(&this->list,&stack0xffffffffffffffd8,recycler);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
JavascriptSet::TryAddToIntSet(Var value)
{
    Assert(this->kind == SetKind::IntSet);
    Var taggedInt = JavascriptConversion::TryCanonicalizeAsTaggedInt<false /* allowNegOne */, false /* allowLossyConversion */>(value);
    if (!taggedInt)
    {
        return false;
    }

    int32 intVal = TaggedInt::ToInt32(taggedInt);
    if (!this->u.intSet->TestAndSet(intVal))
    {
        this->list.Append(taggedInt, this->GetRecycler());
    }
    return true;
}